

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::Desugarer::desugarFile
          (Desugarer *this,AST **ast,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>_>
          *tlas)

{
  initializer_list<jsonnet::internal::FodderElement> __l;
  initializer_list<jsonnet::internal::FodderElement> __l_00;
  bool bVar1;
  DesugaredObject *pDVar2;
  Local *pLVar3;
  Desugarer *this_00;
  allocator<char32_t> *__a;
  long in_RDX;
  long *in_RSI;
  Identifier *body;
  Tokens tokens;
  AST *expr;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>
  *pair;
  iterator __end3;
  iterator __begin3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>_>
  *__range3;
  ArgParams args;
  LocationRange tla_loc;
  uint in_stack_00000404;
  AST **in_stack_00000408;
  Desugarer *in_stack_00000410;
  Fodder line_end;
  Fodder line_end_blank;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  empty;
  DesugaredObject *std_obj;
  char *in_stack_00000730;
  string *in_stack_00000738;
  UString *in_stack_fffffffffffffae8;
  Identifier **args_2;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_fffffffffffffaf0;
  undefined1 *args_1;
  undefined1 *in_stack_fffffffffffffaf8;
  FodderElement *in_stack_fffffffffffffb00;
  string *in_stack_fffffffffffffb08;
  LocationRange *in_stack_fffffffffffffb10;
  LocationRange *in_stack_fffffffffffffb18;
  LocationRange *in_stack_fffffffffffffb20;
  iterator in_stack_fffffffffffffb28;
  char32_t *__s;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_fffffffffffffb30;
  AST *in_stack_fffffffffffffb38;
  AST *in_stack_fffffffffffffb40;
  LocationRange *in_stack_fffffffffffffb48;
  Desugarer *in_stack_fffffffffffffb50;
  bool *in_stack_fffffffffffffb58;
  AST *in_stack_fffffffffffffc18;
  LiteralString *in_stack_fffffffffffffc20;
  Desugarer *in_stack_fffffffffffffc28;
  undefined1 ***local_3c0;
  undefined1 ***local_3a0;
  char32_t local_369 [16];
  Tokens *in_stack_fffffffffffffcd8;
  Allocator *in_stack_fffffffffffffce0;
  undefined1 local_2f0 [15];
  undefined1 local_2e1;
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  local_2e0 [2];
  string *in_stack_fffffffffffffd48;
  Desugarer *in_stack_fffffffffffffd50;
  string local_208 [56];
  LiteralString *local_1d0;
  reference local_1c8;
  _Self local_1c0;
  _Self local_1b8;
  long local_1b0;
  undefined1 local_189 [105];
  undefined8 **local_120;
  undefined1 **local_118 [5];
  undefined8 **local_f0;
  undefined8 local_e8;
  UString local_e0;
  undefined8 **local_c0;
  undefined1 **local_b8 [5];
  undefined8 **local_90;
  undefined8 local_88;
  string local_40 [32];
  DesugaredObject *local_20;
  long local_18;
  long *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  desugar(in_stack_00000410,in_stack_00000408,in_stack_00000404);
  ::std::__cxx11::string::string(local_40,(string *)(*local_10 + 8));
  pDVar2 = stdlibAST(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  ::std::__cxx11::string::~string(local_40);
  local_20 = pDVar2;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x2a1b63);
  local_c0 = local_b8;
  FodderElement::FodderElement
            (in_stack_fffffffffffffb00,(Kind)((ulong)in_stack_fffffffffffffaf8 >> 0x20),
             (uint)in_stack_fffffffffffffaf8,(uint)((ulong)in_stack_fffffffffffffaf0 >> 0x20),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffae8);
  local_90 = local_b8;
  local_88 = 1;
  ::std::allocator<jsonnet::internal::FodderElement>::allocator
            ((allocator<jsonnet::internal::FodderElement> *)0x2a1bbc);
  __l._M_len = (size_type)in_stack_fffffffffffffb30;
  __l._M_array = in_stack_fffffffffffffb28;
  ::std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ::vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
            *)in_stack_fffffffffffffb20,__l,(allocator_type *)in_stack_fffffffffffffb18);
  ::std::allocator<jsonnet::internal::FodderElement>::~allocator
            ((allocator<jsonnet::internal::FodderElement> *)0x2a1bf0);
  local_3a0 = (undefined1 ***)&local_90;
  do {
    local_3a0 = local_3a0 + -5;
    FodderElement::~FodderElement((FodderElement *)0x2a1c25);
  } while (local_3a0 != local_b8);
  local_120 = local_118;
  FodderElement::FodderElement
            (in_stack_fffffffffffffb00,(Kind)((ulong)in_stack_fffffffffffffaf8 >> 0x20),
             (uint)in_stack_fffffffffffffaf8,(uint)((ulong)in_stack_fffffffffffffaf0 >> 0x20),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffae8);
  local_f0 = local_118;
  local_e8 = 1;
  ::std::allocator<jsonnet::internal::FodderElement>::allocator
            ((allocator<jsonnet::internal::FodderElement> *)0x2a1c98);
  __l_00._M_len = (size_type)in_stack_fffffffffffffb30;
  __l_00._M_array = in_stack_fffffffffffffb28;
  ::std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ::vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
            *)in_stack_fffffffffffffb20,__l_00,(allocator_type *)in_stack_fffffffffffffb18);
  ::std::allocator<jsonnet::internal::FodderElement>::~allocator
            ((allocator<jsonnet::internal::FodderElement> *)0x2a1ccc);
  local_3c0 = (undefined1 ***)&local_f0;
  do {
    local_3c0 = local_3c0 + -5;
    FodderElement::~FodderElement((FodderElement *)0x2a1d01);
  } while (local_3c0 != local_118);
  if (local_18 != 0) {
    in_stack_fffffffffffffc28 = (Desugarer *)local_189;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb30,(char *)in_stack_fffffffffffffb28,
               (allocator<char> *)in_stack_fffffffffffffb20);
    LocationRange::LocationRange(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
    ::std::__cxx11::string::~string((string *)(local_189 + 1));
    ::std::allocator<char>::~allocator((allocator<char> *)local_189);
    ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::vector
              ((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
               0x2a1d9e);
    local_1b0 = local_18;
    local_1b8._M_node =
         (_Base_ptr)
         ::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>_>
                  *)in_stack_fffffffffffffae8);
    local_1c0._M_node =
         (_Base_ptr)
         ::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>_>
                *)in_stack_fffffffffffffae8);
    while( true ) {
      bVar1 = ::std::operator!=(&local_1b8,&local_1c0);
      if (!bVar1) break;
      local_1c8 = ::std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>
                  ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>
                               *)0x2a1e03);
      if (((local_1c8->second).isCode & 1U) == 0) {
        decode_utf8((string *)in_stack_fffffffffffffb28);
        local_1d0 = str((Desugarer *)in_stack_fffffffffffffb00,(UString *)in_stack_fffffffffffffaf8)
        ;
        ::std::__cxx11::u32string::~u32string(in_stack_fffffffffffffaf0);
      }
      else {
        ::std::operator+((char *)in_stack_fffffffffffffb38,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffb30);
        ::std::__cxx11::string::c_str();
        jsonnet_lex(in_stack_00000738,in_stack_00000730);
        ::std::__cxx11::string::~string(local_208);
        in_stack_fffffffffffffc20 =
             (LiteralString *)jsonnet_parse(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
        local_1d0 = in_stack_fffffffffffffc20;
        desugar(in_stack_00000410,in_stack_00000408,in_stack_00000404);
        ::std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
        ~list((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)0x2a1ecb)
        ;
      }
      decode_utf8((string *)in_stack_fffffffffffffb28);
      id((Desugarer *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
      ::std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>::
      emplace_back<std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Identifier_const*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                ((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                  *)in_stack_fffffffffffffb20,
                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)in_stack_fffffffffffffb18,(Identifier **)in_stack_fffffffffffffb10,
                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)in_stack_fffffffffffffb08,(AST **)in_stack_fffffffffffffb00,
                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)in_stack_fffffffffffffaf8);
      ::std::__cxx11::u32string::~u32string(in_stack_fffffffffffffaf0);
      ::std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>
                    *)in_stack_fffffffffffffaf0);
    }
    ::std::allocator<char32_t>::allocator((allocator<char32_t> *)0x2a22b7);
    ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_fffffffffffffb30,(char32_t *)in_stack_fffffffffffffb28,
               (allocator<char32_t> *)in_stack_fffffffffffffb20);
    id((Desugarer *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    ::std::__cxx11::u32string::~u32string(in_stack_fffffffffffffaf0);
    ::std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x2a230e);
    singleBind(in_stack_fffffffffffffc28,(Identifier *)in_stack_fffffffffffffc20,
               in_stack_fffffffffffffc18);
    var((Desugarer *)in_stack_fffffffffffffaf0,(Identifier *)in_stack_fffffffffffffae8);
    type((Desugarer *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
    ::std::allocator<char32_t>::allocator((allocator<char32_t> *)0x2a23aa);
    ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_fffffffffffffb30,(char32_t *)in_stack_fffffffffffffb28,
               (allocator<char32_t> *)in_stack_fffffffffffffb20);
    str((Desugarer *)in_stack_fffffffffffffb00,(UString *)in_stack_fffffffffffffaf8);
    primitiveEquals(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,
                    in_stack_fffffffffffffb38);
    local_2e0[0]._0_8_ =
         make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Identifier_const*&>
                   ((Desugarer *)in_stack_fffffffffffffb00,
                    (LocationRange *)in_stack_fffffffffffffaf8,
                    (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)in_stack_fffffffffffffaf0,(Identifier **)in_stack_fffffffffffffae8);
    local_2e1 = 0;
    local_2f0[0xe] = 0;
    in_stack_fffffffffffffb00 = (FodderElement *)(local_2f0 + 0xe);
    in_stack_fffffffffffffaf8 = EF;
    args_1 = EF;
    args_2 = (Identifier **)&local_2e1;
    local_2e0[0]._8_8_ =
         make<jsonnet::internal::Apply,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>&,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool>
                   ((Desugarer *)in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,
                    (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)in_stack_fffffffffffffb18,(Var **)in_stack_fffffffffffffb10,
                    (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)in_stack_fffffffffffffb08,
                    (vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                     *)in_stack_fffffffffffffb00,(bool *)in_stack_fffffffffffffb40,
                    (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)in_stack_fffffffffffffb48,
                    (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb58);
    local_2f0._0_8_ =
         make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Identifier_const*&>
                   ((Desugarer *)in_stack_fffffffffffffb00,
                    (LocationRange *)in_stack_fffffffffffffaf8,
                    (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)args_1,args_2);
    in_stack_fffffffffffffaf0 =
         (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)local_2f0;
    in_stack_fffffffffffffae8 = &local_e0;
    make<jsonnet::internal::Conditional,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Apply*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Apply*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Var*>
              ((Desugarer *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,
               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                *)in_stack_fffffffffffffb10,(Apply **)in_stack_fffffffffffffb08,
               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                *)in_stack_fffffffffffffb00,(Apply **)in_stack_fffffffffffffaf8,
               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                *)in_stack_fffffffffffffb30,(Var **)in_stack_fffffffffffffb38);
    pLVar3 = make<jsonnet::internal::Local,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>,jsonnet::internal::Conditional*>
                       ((Desugarer *)in_stack_fffffffffffffb00,
                        (LocationRange *)in_stack_fffffffffffffaf8,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)in_stack_fffffffffffffaf0,
                        (vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                         *)in_stack_fffffffffffffae8,(Conditional **)0x2a25a2);
    *local_10 = (long)pLVar3;
    ::std::__cxx11::u32string::~u32string(in_stack_fffffffffffffaf0);
    ::std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x2a25d3);
    ::std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
    ~vector((vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
             *)in_stack_fffffffffffffb00);
    ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
    ~vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
            in_stack_fffffffffffffb00);
    LocationRange::~LocationRange((LocationRange *)0x2a25fa);
  }
  ::std::allocator<char32_t>::allocator((allocator<char32_t> *)0x2a26f1);
  ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
            (in_stack_fffffffffffffb30,(char32_t *)in_stack_fffffffffffffb28,
             (allocator<char32_t> *)in_stack_fffffffffffffb20);
  this_00 = (Desugarer *)id((Desugarer *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
  std(this_00);
  singleBind(in_stack_fffffffffffffc28,(Identifier *)in_stack_fffffffffffffc20,
             in_stack_fffffffffffffc18);
  pLVar3 = make<jsonnet::internal::Local,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>,jsonnet::internal::AST*&>
                     ((Desugarer *)in_stack_fffffffffffffb00,
                      (LocationRange *)in_stack_fffffffffffffaf8,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)in_stack_fffffffffffffaf0,
                      (vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                       *)in_stack_fffffffffffffae8,(AST **)0x2a2786);
  *local_10 = (long)pLVar3;
  ::std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
  ~vector((vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_> *
          )in_stack_fffffffffffffb00);
  ::std::__cxx11::u32string::~u32string(in_stack_fffffffffffffaf0);
  ::std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x2a27c4);
  __a = (allocator<char32_t> *)(*local_10 + 8);
  __s = local_369;
  ::std::allocator<char32_t>::allocator((allocator<char32_t> *)0x2a27ea);
  ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
            ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)pLVar3
             ,__s,__a);
  id((Desugarer *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
  singleBind(in_stack_fffffffffffffc28,(Identifier *)in_stack_fffffffffffffc20,
             in_stack_fffffffffffffc18);
  pLVar3 = make<jsonnet::internal::Local,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>,jsonnet::internal::AST*&>
                     ((Desugarer *)in_stack_fffffffffffffb00,
                      (LocationRange *)in_stack_fffffffffffffaf8,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)in_stack_fffffffffffffaf0,
                      (vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                       *)in_stack_fffffffffffffae8,(AST **)0x2a286e);
  *local_10 = (long)pLVar3;
  ::std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
  ~vector((vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_> *
          )in_stack_fffffffffffffb00);
  ::std::__cxx11::u32string::~u32string(in_stack_fffffffffffffaf0);
  ::std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x2a28ac);
  ::std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             *)in_stack_fffffffffffffb00);
  ::std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             *)in_stack_fffffffffffffb00);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffb00);
  return;
}

Assistant:

void desugarFile(AST *&ast, std::map<std::string, VmExt> *tlas)
    {
        desugar(ast, 0);

        DesugaredObject *std_obj = stdlibAST(ast->location.file);

        std::vector<std::string> empty;
        auto line_end_blank = Fodder{{FodderElement::LINE_END, 1, 0, empty}};
        auto line_end = Fodder{{FodderElement::LINE_END, 0, 0, empty}};

        // local body = ast;
        // if std.type(body) == "function") then
        //     body(tlas...)
        // else
        //     body
        if (tlas != nullptr) {
            LocationRange tla_loc("Top-level function");
            ArgParams args;
            for (const auto &pair : *tlas) {
                AST *expr;
                if (pair.second.isCode) {
                    Tokens tokens = jsonnet_lex("tla:" + pair.first, pair.second.data.c_str());
                    expr = jsonnet_parse(alloc, tokens);
                    desugar(expr, 0);
                } else {
                    expr = str(decode_utf8(pair.second.data));
                }
                // Add them as named arguments, so order does not matter.
                args.emplace_back(EF, id(decode_utf8(pair.first)), EF, expr, EF);
            }
            const Identifier *body = id(U"top_level");
            ast =
                make<Local>(ast->location,
                            line_end_blank,
                            singleBind(body, ast),
                            make<Conditional>(E,
                                              line_end,
                                              primitiveEquals(E, type(var(body)), str(U"function")),
                                              EF,
                                              make<Apply>(tla_loc,
                                                          EF,
                                                          make<Var>(E, line_end, body),
                                                          EF,
                                                          args,
                                                          false,  // trailing comma
                                                          EF,
                                                          EF,
                                                          false  // tailstrict
                                                          ),
                                              line_end,
                                              make<Var>(E, line_end, body)));
        }

        // local $std = (std.jsonnet stuff); std = $std; ast
        // The standard library is bound to $std, which cannot be overriden,
        // so redefining std won't break expressions that desugar to calls
        // to standard library functions.
        ast = make<Local>(ast->location, EF, singleBind(id(U"std"), std()), ast);
        ast = make<Local>(ast->location, EF, singleBind(id(U"$std"), std_obj), ast);
    }